

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

Logger * __thiscall el::Logger::operator=(Logger *this,Logger *logger)

{
  if (logger != this) {
    base::utils::safeDelete<el::base::TypedConfigurations>(&this->m_typedConfigurations);
    std::__cxx11::string::_M_assign((string *)&this->m_id);
    this->m_typedConfigurations = logger->m_typedConfigurations;
    std::__cxx11::string::_M_assign((string *)&this->m_parentApplicationName);
    this->m_isConfigured = logger->m_isConfigured;
    Configurations::operator=(&this->m_configurations,&logger->m_configurations);
    base::utils::std::
    _Hashtable<el::Level,_std::pair<const_el::Level,_unsigned_int>,_std::allocator<std::pair<const_el::Level,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<el::Level>,_std::hash<el::Level>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::operator=(&(this->m_unflushedCount)._M_h,&(logger->m_unflushedCount)._M_h);
    this->m_logStreamsReference = logger->m_logStreamsReference;
  }
  return this;
}

Assistant:

Logger& Logger::operator=(const Logger& logger) {
  if (&logger != this) {
    base::utils::safeDelete(m_typedConfigurations);
    m_id = logger.m_id;
    m_typedConfigurations = logger.m_typedConfigurations;
    m_parentApplicationName = logger.m_parentApplicationName;
    m_isConfigured = logger.m_isConfigured;
    m_configurations = logger.m_configurations;
    m_unflushedCount = logger.m_unflushedCount;
    m_logStreamsReference = logger.m_logStreamsReference;
  }
  return *this;
}